

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O2

void __thiscall
tcu::ResultCollector::addResult(ResultCollector *this,qpTestResult result,string *msg)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  MessageBuilder local_1a0;
  
  if (this->m_log != (TestLog *)0x0) {
    this_00 = &local_1a0.m_str;
    local_1a0.m_log = this->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,(string *)&this->m_prefix);
    std::operator<<((ostream *)this_00,(string *)msg);
    MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  iVar1 = testResultSeverity(result);
  iVar2 = testResultSeverity(this->m_result);
  if (iVar2 < iVar1) {
    this->m_result = result;
    std::__cxx11::string::_M_assign((string *)&this->m_message);
  }
  return;
}

Assistant:

void ResultCollector::addResult (qpTestResult result, const std::string& msg)
{
	if (m_log != DE_NULL)
		(*m_log) << TestLog::Message << m_prefix << msg << TestLog::EndMessage;

	if (testResultSeverity(result) > testResultSeverity(m_result))
	{
		m_result = result;
		m_message = msg;
	}
}